

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

FileBufSlot * read_ivf_file(FileReader data)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  FileBufSlot *pFVar3;
  size_t sVar4;
  long lVar5;
  RK_U32 local_5c;
  RK_U32 eos;
  size_t read_size;
  size_t data_size;
  FileBufSlot *slot;
  FILE *fp;
  size_t ivf_data_size;
  RK_U8 ivf_data [12];
  FileReaderImpl *impl;
  FileReader data_local;
  
  ivf_data._4_8_ = data;
  memset((void *)((long)&ivf_data_size + 4),0,0xc);
  __stream = *(FILE **)ivf_data._4_8_;
  local_5c = 0;
  sVar2 = fread((void *)((long)&ivf_data_size + 4),1,0xc,__stream);
  if (sVar2 != 0xc) {
    pFVar3 = (FileBufSlot *)mpp_osal_calloc("read_ivf_file",0x28);
    pFVar3->eos = 1;
    return pFVar3;
  }
  *(long *)(ivf_data._4_8_ + 0x40) = *(long *)(ivf_data._4_8_ + 0x40) + 0xc;
  sVar2 = (size_t)CONCAT13(ivf_data_size._7_1_,ivf_data_size._4_3_);
  pFVar3 = (FileBufSlot *)mpp_osal_malloc("read_ivf_file",sVar2 + 0x1027 & 0xfffffffffffff000);
  pFVar3->data = (char *)(pFVar3 + 1);
  sVar4 = fread(pFVar3->data,1,sVar2,__stream);
  *(size_t *)(ivf_data._4_8_ + 0x40) = sVar4 + *(long *)(ivf_data._4_8_ + 0x40);
  *(size_t *)(ivf_data._4_8_ + 0x48) = sVar4;
  if (sVar2 == 0) {
    lVar5 = ftell(__stream);
    _mpp_log_l(2,"mpi_dec_utils","data_size is zero! ftell size %d\n",0,lVar5);
  }
  else if (((sVar4 == sVar2) && (iVar1 = feof(__stream), iVar1 == 0)) &&
          (*(ulong *)(ivf_data._4_8_ + 0x40) < *(ulong *)(ivf_data._4_8_ + 8))) goto LAB_00108841;
  local_5c = 1;
LAB_00108841:
  pFVar3->buf = (MppBuffer)0x0;
  pFVar3->size = sVar4;
  pFVar3->eos = local_5c;
  return pFVar3;
}

Assistant:

static FileBufSlot *read_ivf_file(FileReader data)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;
    RK_U8 ivf_data[IVF_FRAME_HEADER_LENGTH] = {0};
    size_t ivf_data_size = IVF_FRAME_HEADER_LENGTH;
    FILE *fp = impl->fp_input;
    FileBufSlot *slot = NULL;
    size_t data_size = 0;
    size_t read_size = 0;
    RK_U32 eos = 0;

    if (fread(ivf_data, 1, ivf_data_size, fp) != ivf_data_size) {
        /* end of frame queue */
        slot = mpp_calloc(FileBufSlot, 1);
        slot->eos = 1;

        return slot;
    }

    impl->read_total += ivf_data_size;
    data_size = ivf_data[0] | (ivf_data[1] << 8) | (ivf_data[2] << 16) | (ivf_data[3] << 24);
    slot = mpp_malloc_size(FileBufSlot, MPP_ALIGN(sizeof(FileBufSlot) + data_size, SZ_4K));
    slot->data = (char *)(slot + 1);
    read_size = fread(slot->data, 1, data_size, fp);
    impl->read_total += read_size;
    impl->read_size = read_size;

    if (!data_size)
        mpp_err("data_size is zero! ftell size %d\n", ftell(fp));
    /* check reach eos whether or not */
    if (!data_size || read_size != data_size || feof(fp) || impl->read_total >= impl->file_size)
        eos = 1;

    slot->buf = NULL;
    slot->size = read_size;
    slot->eos = eos;

    return slot;
}